

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O0

StringTree * __thiscall
kj::StringTree::
concat<kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>>
          (StringTree *__return_storage_ptr__,StringTree *this,StringTree *params,
          StringTree *params_1,ArrayPtr<const_char> *params_2,ArrayPtr<const_char> *params_3,
          ArrayPtr<const_char> *params_4,ArrayPtr<const_char> *params_5,
          ArrayPtr<const_char> *params_6,ArrayPtr<const_char> *params_7,
          ArrayPtr<const_char> *params_8,CappedArray<char,_14UL> *params_9,
          ArrayPtr<const_char> *params_10,StringTree *params_11,ArrayPtr<const_char> *params_12,
          ArrayPtr<const_char> *params_13,ArrayPtr<const_char> *params_14,
          ArrayPtr<const_char> *params_15,ArrayPtr<const_char> *params_16,
          ArrayPtr<const_char> *params_17,ArrayPtr<const_char> *params_18,
          CappedArray<char,_14UL> *params_19,ArrayPtr<const_char> *params_20,StringTree *params_21,
          ArrayPtr<const_char> *params_22,ArrayPtr<const_char> *params_23,
          ArrayPtr<const_char> *params_24,ArrayPtr<const_char> *params_25,
          ArrayPtr<const_char> *params_26,ArrayPtr<const_char> *params_27,
          ArrayPtr<const_char> *params_28,CappedArray<char,_14UL> *params_29,
          ArrayPtr<const_char> *params_30,StringTree *params_31,ArrayPtr<const_char> *params_32,
          ArrayPtr<const_char> *params_33,ArrayPtr<const_char> *params_34,
          ArrayPtr<const_char> *params_35,ArrayPtr<const_char> *params_36,
          ArrayPtr<const_char> *params_37,ArrayPtr<const_char> *params_38,
          CappedArray<char,_14UL> *params_39,ArrayPtr<const_char> *params_40,StringTree *params_41,
          ArrayPtr<const_char> *params_42,ArrayPtr<const_char> *params_43,
          ArrayPtr<const_char> *params_44,ArrayPtr<const_char> *params_45,
          ArrayPtr<const_char> *params_46,ArrayPtr<const_char> *params_47,
          ArrayPtr<const_char> *params_48,CappedArray<char,_14UL> *params_49,
          ArrayPtr<const_char> *params_50)

{
  size_t sVar1;
  StringTree *pSVar2;
  ArrayPtr<const_char> *pAVar3;
  CappedArray<char,_14UL> *pCVar4;
  char *pos;
  StringTree *rest;
  ArrayPtr<const_char> *rest_2;
  ArrayPtr<const_char> *rest_3;
  ArrayPtr<const_char> *rest_4;
  ArrayPtr<const_char> *rest_5;
  ArrayPtr<const_char> *rest_6;
  ArrayPtr<const_char> *rest_7;
  ArrayPtr<const_char> *rest_9;
  StringTree *rest_10;
  ArrayPtr<const_char> *rest_11;
  ArrayPtr<const_char> *rest_12;
  ArrayPtr<const_char> *rest_13;
  ArrayPtr<const_char> *rest_14;
  ArrayPtr<const_char> *rest_15;
  ArrayPtr<const_char> *rest_16;
  ArrayPtr<const_char> *rest_17;
  CappedArray<char,_14UL> *rest_18;
  ArrayPtr<const_char> *rest_19;
  StringTree *rest_20;
  ArrayPtr<const_char> *rest_21;
  ArrayPtr<const_char> *rest_22;
  ArrayPtr<const_char> *rest_23;
  ArrayPtr<const_char> *rest_24;
  ArrayPtr<const_char> *rest_25;
  ArrayPtr<const_char> *rest_26;
  ArrayPtr<const_char> *rest_27;
  CappedArray<char,_14UL> *rest_28;
  ArrayPtr<const_char> *rest_29;
  StringTree *rest_30;
  ArrayPtr<const_char> *rest_31;
  ArrayPtr<const_char> *rest_32;
  ArrayPtr<const_char> *rest_33;
  ArrayPtr<const_char> *rest_34;
  ArrayPtr<const_char> *rest_35;
  ArrayPtr<const_char> *rest_36;
  ArrayPtr<const_char> *rest_37;
  CappedArray<char,_14UL> *rest_38;
  ArrayPtr<const_char> *rest_39;
  StringTree *rest_40;
  ArrayPtr<const_char> *rest_41;
  ArrayPtr<const_char> *rest_42;
  ArrayPtr<const_char> *rest_43;
  ArrayPtr<const_char> *rest_44;
  ArrayPtr<const_char> *rest_45;
  ArrayPtr<const_char> *rest_46;
  ArrayPtr<const_char> *rest_47;
  CappedArray<char,_14UL> *rest_48;
  ArrayPtr<const_char> *rest_49;
  size_type extraout_RDX;
  size_type extraout_RDX_00;
  size_type extraout_RDX_01;
  initializer_list<unsigned_long> nums;
  initializer_list<unsigned_long> nums_00;
  initializer_list<unsigned_long> nums_01;
  size_t local_5a0;
  size_t local_598;
  size_t local_590;
  size_t local_588;
  size_t local_580;
  size_t local_578;
  size_t local_570;
  size_t local_568;
  size_t local_560;
  size_t local_558;
  size_t local_550;
  size_t local_548;
  size_t local_540;
  size_t local_538;
  size_t local_530;
  size_t local_528;
  size_t local_520;
  size_t local_518;
  size_t local_510;
  size_t local_508;
  size_t local_500;
  size_t local_4f8;
  size_t local_4f0;
  size_t local_4e8;
  size_t local_4e0;
  size_t local_4d8;
  size_t local_4d0;
  size_t local_4c8;
  size_t local_4c0;
  size_t local_4b8;
  size_t local_4b0;
  size_t local_4a8;
  size_t local_4a0;
  size_t local_498;
  size_t local_490;
  size_t local_488;
  size_t local_480;
  size_t local_478;
  size_t local_470;
  size_t local_468;
  size_t local_460;
  size_t local_458;
  size_t local_450;
  size_t local_448;
  size_t local_440;
  size_t local_438;
  size_t local_430;
  size_t local_428;
  size_t local_420;
  size_t local_418;
  size_t local_410;
  _ *local_408;
  undefined8 local_400;
  Array<kj::StringTree::Branch> local_3f8;
  size_t local_3e0;
  size_t local_3d8;
  size_t local_3d0;
  size_t local_3c8;
  size_t local_3c0;
  size_t local_3b8;
  size_t local_3b0;
  size_t local_3a8;
  size_t local_3a0;
  size_t local_398;
  size_t local_390;
  size_t local_388;
  size_t local_380;
  size_t local_378;
  size_t local_370;
  size_t local_368;
  size_t local_360;
  size_t local_358;
  size_t local_350;
  size_t local_348;
  size_t local_340;
  size_t local_338;
  size_t local_330;
  size_t local_328;
  size_t local_320;
  size_t local_318;
  size_t local_310;
  size_t local_308;
  size_t local_300;
  size_t local_2f8;
  size_t local_2f0;
  size_t local_2e8;
  size_t local_2e0;
  size_t local_2d8;
  size_t local_2d0;
  size_t local_2c8;
  size_t local_2c0;
  size_t local_2b8;
  size_t local_2b0;
  size_t local_2a8;
  size_t local_2a0;
  size_t local_298;
  size_t local_290;
  size_t local_288;
  size_t local_280;
  size_t local_278;
  size_t local_270;
  size_t local_268;
  size_t local_260;
  size_t local_258;
  size_t local_250;
  _ *local_248;
  undefined8 local_240;
  String local_238;
  size_t local_210;
  size_t local_208;
  size_t local_200;
  size_t local_1f8;
  size_t local_1f0;
  size_t local_1e8;
  size_t local_1e0;
  size_t local_1d8;
  size_t local_1d0;
  size_t local_1c8;
  size_t local_1c0;
  size_t local_1b8;
  size_t local_1b0;
  size_t local_1a8;
  size_t local_1a0;
  size_t local_198;
  size_t local_190;
  size_t local_188;
  size_t local_180;
  size_t local_178;
  size_t local_170;
  size_t local_168;
  size_t local_160;
  size_t local_158;
  size_t local_150;
  size_t local_148;
  size_t local_140;
  size_t local_138;
  size_t local_130;
  size_t local_128;
  size_t local_120;
  size_t local_118;
  size_t local_110;
  size_t local_108;
  size_t local_100;
  size_t local_f8;
  size_t local_f0;
  size_t local_e8;
  size_t local_e0;
  size_t local_d8;
  size_t local_d0;
  size_t local_c8;
  size_t local_c0;
  size_t local_b8;
  size_t local_b0;
  size_t local_a8;
  size_t local_a0;
  size_t local_98;
  size_t local_90;
  size_t local_88;
  size_t local_80;
  _ *local_78;
  undefined8 local_70;
  undefined1 local_61;
  ArrayPtr<const_char> *local_60;
  ArrayPtr<const_char> *params_local_4;
  ArrayPtr<const_char> *params_local_3;
  ArrayPtr<const_char> *params_local_2;
  StringTree *params_local_1;
  StringTree *params_local;
  StringTree *result;
  
  local_61 = 0;
  local_60 = params_3;
  params_local_4 = params_2;
  params_local_3 = (ArrayPtr<const_char> *)params_1;
  params_local_2 = (ArrayPtr<const_char> *)params;
  params_local_1 = this;
  params_local = __return_storage_ptr__;
  StringTree(__return_storage_ptr__);
  local_210 = size(params_local_1);
  local_208 = size((StringTree *)params_local_2);
  local_200 = ArrayPtr<const_char>::size(params_local_3);
  local_1f8 = ArrayPtr<const_char>::size(params_local_4);
  local_1f0 = ArrayPtr<const_char>::size(local_60);
  local_1e8 = ArrayPtr<const_char>::size(params_4);
  local_1e0 = ArrayPtr<const_char>::size(params_5);
  local_1d8 = ArrayPtr<const_char>::size(params_6);
  local_1d0 = ArrayPtr<const_char>::size(params_7);
  local_1c8 = CappedArray<char,_14UL>::size((CappedArray<char,_14UL> *)params_8);
  local_1c0 = ArrayPtr<const_char>::size((ArrayPtr<const_char> *)params_9);
  local_1b8 = size((StringTree *)params_10);
  local_1b0 = ArrayPtr<const_char>::size((ArrayPtr<const_char> *)params_11);
  local_1a8 = ArrayPtr<const_char>::size(params_12);
  local_1a0 = ArrayPtr<const_char>::size(params_13);
  local_198 = ArrayPtr<const_char>::size(params_14);
  local_190 = ArrayPtr<const_char>::size(params_15);
  local_188 = ArrayPtr<const_char>::size(params_16);
  local_180 = ArrayPtr<const_char>::size(params_17);
  local_178 = CappedArray<char,_14UL>::size((CappedArray<char,_14UL> *)params_18);
  local_170 = ArrayPtr<const_char>::size((ArrayPtr<const_char> *)params_19);
  local_168 = size((StringTree *)params_20);
  local_160 = ArrayPtr<const_char>::size((ArrayPtr<const_char> *)params_21);
  local_158 = ArrayPtr<const_char>::size(params_22);
  local_150 = ArrayPtr<const_char>::size(params_23);
  local_148 = ArrayPtr<const_char>::size(params_24);
  local_140 = ArrayPtr<const_char>::size(params_25);
  local_138 = ArrayPtr<const_char>::size(params_26);
  local_130 = ArrayPtr<const_char>::size(params_27);
  local_128 = CappedArray<char,_14UL>::size((CappedArray<char,_14UL> *)params_28);
  local_120 = ArrayPtr<const_char>::size((ArrayPtr<const_char> *)params_29);
  local_118 = size((StringTree *)params_30);
  local_110 = ArrayPtr<const_char>::size((ArrayPtr<const_char> *)params_31);
  local_108 = ArrayPtr<const_char>::size(params_32);
  local_100 = ArrayPtr<const_char>::size(params_33);
  local_f8 = ArrayPtr<const_char>::size(params_34);
  local_f0 = ArrayPtr<const_char>::size(params_35);
  local_e8 = ArrayPtr<const_char>::size(params_36);
  local_e0 = ArrayPtr<const_char>::size(params_37);
  local_d8 = CappedArray<char,_14UL>::size((CappedArray<char,_14UL> *)params_38);
  local_d0 = ArrayPtr<const_char>::size((ArrayPtr<const_char> *)params_39);
  local_c8 = size((StringTree *)params_40);
  local_c0 = ArrayPtr<const_char>::size((ArrayPtr<const_char> *)params_41);
  local_b8 = ArrayPtr<const_char>::size(params_42);
  local_b0 = ArrayPtr<const_char>::size(params_43);
  local_a8 = ArrayPtr<const_char>::size(params_44);
  local_a0 = ArrayPtr<const_char>::size(params_45);
  local_98 = ArrayPtr<const_char>::size(params_46);
  local_90 = ArrayPtr<const_char>::size(params_47);
  local_88 = CappedArray<char,_14UL>::size((CappedArray<char,_14UL> *)params_48);
  local_80 = ArrayPtr<const_char>::size((ArrayPtr<const_char> *)params_49);
  local_78 = (_ *)&local_210;
  local_70 = 0x33;
  nums._M_len = extraout_RDX;
  nums._M_array = (iterator)0x33;
  sVar1 = _::sum(local_78,nums);
  __return_storage_ptr__->size_ = sVar1;
  pSVar2 = fwd<kj::StringTree>(params_local_1);
  local_3e0 = flatSize(pSVar2);
  pSVar2 = fwd<kj::StringTree>((NoInfer<kj::StringTree> *)params_local_2);
  local_3d8 = flatSize(pSVar2);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_local_3);
  local_3d0 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_local_4);
  local_3c8 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(local_60);
  local_3c0 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_4);
  local_3b8 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_5);
  local_3b0 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_6);
  local_3a8 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_7);
  local_3a0 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pCVar4 = fwd<kj::CappedArray<char,14ul>>((NoInfer<kj::CappedArray<char,_14UL>_> *)params_8);
  local_398 = flatSize<kj::CappedArray<char,14ul>>(pCVar4);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_9);
  local_390 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pSVar2 = fwd<kj::StringTree>((NoInfer<kj::StringTree> *)params_10);
  local_388 = flatSize(pSVar2);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_11);
  local_380 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_12);
  local_378 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_13);
  local_370 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_14);
  local_368 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_15);
  local_360 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_16);
  local_358 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_17);
  local_350 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pCVar4 = fwd<kj::CappedArray<char,14ul>>((NoInfer<kj::CappedArray<char,_14UL>_> *)params_18);
  local_348 = flatSize<kj::CappedArray<char,14ul>>(pCVar4);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_19);
  local_340 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pSVar2 = fwd<kj::StringTree>((NoInfer<kj::StringTree> *)params_20);
  local_338 = flatSize(pSVar2);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_21);
  local_330 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_22);
  local_328 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_23);
  local_320 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_24);
  local_318 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_25);
  local_310 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_26);
  local_308 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_27);
  local_300 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pCVar4 = fwd<kj::CappedArray<char,14ul>>((NoInfer<kj::CappedArray<char,_14UL>_> *)params_28);
  local_2f8 = flatSize<kj::CappedArray<char,14ul>>(pCVar4);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_29);
  local_2f0 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pSVar2 = fwd<kj::StringTree>((NoInfer<kj::StringTree> *)params_30);
  local_2e8 = flatSize(pSVar2);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_31);
  local_2e0 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_32);
  local_2d8 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_33);
  local_2d0 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_34);
  local_2c8 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_35);
  local_2c0 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_36);
  local_2b8 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_37);
  local_2b0 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pCVar4 = fwd<kj::CappedArray<char,14ul>>((NoInfer<kj::CappedArray<char,_14UL>_> *)params_38);
  local_2a8 = flatSize<kj::CappedArray<char,14ul>>(pCVar4);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_39);
  local_2a0 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pSVar2 = fwd<kj::StringTree>((NoInfer<kj::StringTree> *)params_40);
  local_298 = flatSize(pSVar2);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_41);
  local_290 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_42);
  local_288 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_43);
  local_280 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_44);
  local_278 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_45);
  local_270 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_46);
  local_268 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_47);
  local_260 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pCVar4 = fwd<kj::CappedArray<char,14ul>>((NoInfer<kj::CappedArray<char,_14UL>_> *)params_48);
  local_258 = flatSize<kj::CappedArray<char,14ul>>(pCVar4);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_49);
  local_250 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  local_248 = (_ *)&local_3e0;
  local_240 = 0x33;
  nums_00._M_len = extraout_RDX_00;
  nums_00._M_array = (iterator)0x33;
  sVar1 = _::sum(local_248,nums_00);
  heapString(&local_238,sVar1);
  String::operator=(&__return_storage_ptr__->text,&local_238);
  String::~String(&local_238);
  pSVar2 = fwd<kj::StringTree>(params_local_1);
  local_5a0 = branchCount(pSVar2);
  pSVar2 = fwd<kj::StringTree>((NoInfer<kj::StringTree> *)params_local_2);
  local_598 = branchCount(pSVar2);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_local_3);
  local_590 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_local_4);
  local_588 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(local_60);
  local_580 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_4);
  local_578 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_5);
  local_570 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_6);
  local_568 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_7);
  local_560 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pCVar4 = fwd<kj::CappedArray<char,14ul>>((NoInfer<kj::CappedArray<char,_14UL>_> *)params_8);
  local_558 = branchCount<kj::CappedArray<char,14ul>>(pCVar4);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_9);
  local_550 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pSVar2 = fwd<kj::StringTree>((NoInfer<kj::StringTree> *)params_10);
  local_548 = branchCount(pSVar2);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_11);
  local_540 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_12);
  local_538 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_13);
  local_530 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_14);
  local_528 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_15);
  local_520 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_16);
  local_518 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_17);
  local_510 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pCVar4 = fwd<kj::CappedArray<char,14ul>>((NoInfer<kj::CappedArray<char,_14UL>_> *)params_18);
  local_508 = branchCount<kj::CappedArray<char,14ul>>(pCVar4);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_19);
  local_500 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pSVar2 = fwd<kj::StringTree>((NoInfer<kj::StringTree> *)params_20);
  local_4f8 = branchCount(pSVar2);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_21);
  local_4f0 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_22);
  local_4e8 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_23);
  local_4e0 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_24);
  local_4d8 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_25);
  local_4d0 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_26);
  local_4c8 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_27);
  local_4c0 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pCVar4 = fwd<kj::CappedArray<char,14ul>>((NoInfer<kj::CappedArray<char,_14UL>_> *)params_28);
  local_4b8 = branchCount<kj::CappedArray<char,14ul>>(pCVar4);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_29);
  local_4b0 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pSVar2 = fwd<kj::StringTree>((NoInfer<kj::StringTree> *)params_30);
  local_4a8 = branchCount(pSVar2);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_31);
  local_4a0 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_32);
  local_498 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_33);
  local_490 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_34);
  local_488 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_35);
  local_480 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_36);
  local_478 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_37);
  local_470 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pCVar4 = fwd<kj::CappedArray<char,14ul>>((NoInfer<kj::CappedArray<char,_14UL>_> *)params_38);
  local_468 = branchCount<kj::CappedArray<char,14ul>>(pCVar4);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_39);
  local_460 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pSVar2 = fwd<kj::StringTree>((NoInfer<kj::StringTree> *)params_40);
  local_458 = branchCount(pSVar2);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_41);
  local_450 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_42);
  local_448 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_43);
  local_440 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_44);
  local_438 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_45);
  local_430 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_46);
  local_428 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_47);
  local_420 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pCVar4 = fwd<kj::CappedArray<char,14ul>>((NoInfer<kj::CappedArray<char,_14UL>_> *)params_48);
  local_418 = branchCount<kj::CappedArray<char,14ul>>(pCVar4);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_49);
  local_410 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  local_408 = (_ *)&local_5a0;
  local_400 = 0x33;
  nums_01._M_len = extraout_RDX_01;
  nums_01._M_array = (iterator)0x33;
  sVar1 = _::sum(local_408,nums_01);
  heapArray<kj::StringTree::Branch>(&local_3f8,sVar1);
  Array<kj::StringTree::Branch>::operator=(&__return_storage_ptr__->branches,&local_3f8);
  Array<kj::StringTree::Branch>::~Array(&local_3f8);
  pos = String::begin(&__return_storage_ptr__->text);
  pSVar2 = fwd<kj::StringTree>(params_local_1);
  rest = fwd<kj::StringTree>((NoInfer<kj::StringTree> *)params_local_2);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_local_3);
  rest_2 = fwd<kj::ArrayPtr<char_const>>(params_local_4);
  rest_3 = fwd<kj::ArrayPtr<char_const>>(local_60);
  rest_4 = fwd<kj::ArrayPtr<char_const>>(params_4);
  rest_5 = fwd<kj::ArrayPtr<char_const>>(params_5);
  rest_6 = fwd<kj::ArrayPtr<char_const>>(params_6);
  rest_7 = fwd<kj::ArrayPtr<char_const>>(params_7);
  pCVar4 = fwd<kj::CappedArray<char,14ul>>((NoInfer<kj::CappedArray<char,_14UL>_> *)params_8);
  rest_9 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_9);
  rest_10 = fwd<kj::StringTree>((NoInfer<kj::StringTree> *)params_10);
  rest_11 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_11);
  rest_12 = fwd<kj::ArrayPtr<char_const>>(params_12);
  rest_13 = fwd<kj::ArrayPtr<char_const>>(params_13);
  rest_14 = fwd<kj::ArrayPtr<char_const>>(params_14);
  rest_15 = fwd<kj::ArrayPtr<char_const>>(params_15);
  rest_16 = fwd<kj::ArrayPtr<char_const>>(params_16);
  rest_17 = fwd<kj::ArrayPtr<char_const>>(params_17);
  rest_18 = fwd<kj::CappedArray<char,14ul>>((NoInfer<kj::CappedArray<char,_14UL>_> *)params_18);
  rest_19 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_19);
  rest_20 = fwd<kj::StringTree>((NoInfer<kj::StringTree> *)params_20);
  rest_21 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_21);
  rest_22 = fwd<kj::ArrayPtr<char_const>>(params_22);
  rest_23 = fwd<kj::ArrayPtr<char_const>>(params_23);
  rest_24 = fwd<kj::ArrayPtr<char_const>>(params_24);
  rest_25 = fwd<kj::ArrayPtr<char_const>>(params_25);
  rest_26 = fwd<kj::ArrayPtr<char_const>>(params_26);
  rest_27 = fwd<kj::ArrayPtr<char_const>>(params_27);
  rest_28 = fwd<kj::CappedArray<char,14ul>>((NoInfer<kj::CappedArray<char,_14UL>_> *)params_28);
  rest_29 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_29);
  rest_30 = fwd<kj::StringTree>((NoInfer<kj::StringTree> *)params_30);
  rest_31 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_31);
  rest_32 = fwd<kj::ArrayPtr<char_const>>(params_32);
  rest_33 = fwd<kj::ArrayPtr<char_const>>(params_33);
  rest_34 = fwd<kj::ArrayPtr<char_const>>(params_34);
  rest_35 = fwd<kj::ArrayPtr<char_const>>(params_35);
  rest_36 = fwd<kj::ArrayPtr<char_const>>(params_36);
  rest_37 = fwd<kj::ArrayPtr<char_const>>(params_37);
  rest_38 = fwd<kj::CappedArray<char,14ul>>((NoInfer<kj::CappedArray<char,_14UL>_> *)params_38);
  rest_39 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_39);
  rest_40 = fwd<kj::StringTree>((NoInfer<kj::StringTree> *)params_40);
  rest_41 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_41);
  rest_42 = fwd<kj::ArrayPtr<char_const>>(params_42);
  rest_43 = fwd<kj::ArrayPtr<char_const>>(params_43);
  rest_44 = fwd<kj::ArrayPtr<char_const>>(params_44);
  rest_45 = fwd<kj::ArrayPtr<char_const>>(params_45);
  rest_46 = fwd<kj::ArrayPtr<char_const>>(params_46);
  rest_47 = fwd<kj::ArrayPtr<char_const>>(params_47);
  rest_48 = fwd<kj::CappedArray<char,14ul>>((NoInfer<kj::CappedArray<char,_14UL>_> *)params_48);
  rest_49 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_49);
  fill<kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,pos,0,pSVar2,rest,pAVar3,rest_2,rest_3,rest_4,rest_5,rest_6,
             rest_7,pCVar4,rest_9,rest_10,rest_11,rest_12,rest_13,rest_14,rest_15,rest_16,rest_17,
             rest_18,rest_19,rest_20,rest_21,rest_22,rest_23,rest_24,rest_25,rest_26,rest_27,rest_28
             ,rest_29,rest_30,rest_31,rest_32,rest_33,rest_34,rest_35,rest_36,rest_37,rest_38,
             rest_39,rest_40,rest_41,rest_42,rest_43,rest_44,rest_45,rest_46,rest_47,rest_48,rest_49
            );
  return __return_storage_ptr__;
}

Assistant:

StringTree StringTree::concat(Params&&... params) {
  StringTree result;
  result.size_ = _::sum({params.size()...});
  result.text = heapString(
      _::sum({StringTree::flatSize(kj::fwd<Params>(params))...}));
  result.branches = heapArray<StringTree::Branch>(
      _::sum({StringTree::branchCount(kj::fwd<Params>(params))...}));
  result.fill(result.text.begin(), 0, kj::fwd<Params>(params)...);
  return result;
}